

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

string * __thiscall
EOPlus::token_got_string_abi_cxx11_(string *__return_storage_ptr__,EOPlus *this,Token *t)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  string *this_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  iVar1 = *(int *)this;
  switch(iVar1) {
  case 0:
    pcVar4 = "invalid token";
    goto LAB_0012fbef;
  case 1:
    util::variant::GetString_abi_cxx11_(&local_90,(variant *)(this + 8));
    std::operator+(&local_70,"identifier \'",&local_90);
    std::operator+(__return_storage_ptr__,&local_70,"\'");
    break;
  case 2:
    util::variant::GetString_abi_cxx11_(&local_30,(variant *)(this + 8));
    if (local_30._M_string_length < 0x11) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p == &local_30.field_2) {
        local_50.field_2._8_8_ = local_30.field_2._8_8_;
      }
      else {
        local_50._M_dataplus._M_p = local_30._M_dataplus._M_p;
      }
      local_50._M_string_length = local_30._M_string_length;
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_30);
      std::operator+(&local_50,&local_70,"...");
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::operator+(&local_90,"string \'",&local_50);
    std::operator+(__return_storage_ptr__,&local_90,"\'");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_30;
    goto LAB_0012fe5e;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_0012fa85_caseD_3:
    pcVar4 = "unknown token";
LAB_0012fbef:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&local_70);
    return __return_storage_ptr__;
  case 4:
    util::variant::GetString_abi_cxx11_(&local_90,(variant *)(this + 8));
    std::operator+(&local_70,"integer \'",&local_90);
    std::operator+(__return_storage_ptr__,&local_70,"\'");
    break;
  case 8:
    util::variant::GetString_abi_cxx11_(&local_90,(variant *)(this + 8));
    std::operator+(&local_70,"float \'",&local_90);
    std::operator+(__return_storage_ptr__,&local_70,"\'");
    break;
  default:
    if (iVar1 == 0x10) {
      bVar2 = util::variant::GetBool((variant *)(this + 8));
      pcVar4 = "false";
      if (bVar2) {
        pcVar4 = "true";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar4,(allocator<char> *)&local_50);
      std::operator+(&local_70,"boolean \'",&local_90);
      std::operator+(__return_storage_ptr__,&local_70,"\'");
    }
    else if (iVar1 == 0x20) {
      uVar3 = util::variant::GetInt((variant *)(this + 8));
      uVar3 = uVar3 & 0xff;
      switch(uVar3) {
      case 1:
        pcVar4 = "!";
        break;
      case 2:
      case 3:
      case 4:
      case 7:
      case 0xc:
      case 0xe:
      case 0x13:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
switchD_0012fbda_caseD_2:
        pcVar4 = "(unknown)";
        break;
      case 5:
        pcVar4 = "%";
        break;
      case 6:
        pcVar4 = "&";
        break;
      case 8:
        pcVar4 = "(";
        break;
      case 9:
        pcVar4 = ")";
        break;
      case 10:
        pcVar4 = "*";
        break;
      case 0xb:
        pcVar4 = "+";
        break;
      case 0xd:
      case 0x15:
        pcVar4 = "-";
        break;
      case 0xf:
        pcVar4 = "/";
        break;
      case 0x10:
        pcVar4 = "<=";
        break;
      case 0x11:
        pcVar4 = "==";
        break;
      case 0x12:
        pcVar4 = ">=";
        break;
      case 0x1c:
        pcVar4 = "<";
        break;
      case 0x1d:
        pcVar4 = "=";
        break;
      case 0x1e:
        pcVar4 = ">";
        break;
      default:
        if (uVar3 == 0x4c) {
          pcVar4 = "||";
        }
        else if (uVar3 == 0x5c) {
          pcVar4 = "|";
        }
        else if (uVar3 == 0x5e) {
          pcVar4 = "~";
        }
        else if (uVar3 == 0x9e) {
          pcVar4 = "&&";
        }
        else {
          if (uVar3 != 0xf5) goto switchD_0012fbda_caseD_2;
          pcVar4 = "!=";
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar4,(allocator<char> *)&local_50);
      std::operator+(&local_70,"operator \'",&local_90);
      std::operator+(__return_storage_ptr__,&local_70,"\'");
    }
    else {
      if (iVar1 != 0x40) {
        if (iVar1 == 0x80) {
          pcVar4 = "new-line";
          goto LAB_0012fbef;
        }
        if (iVar1 == 0x100) {
          pcVar4 = "end of file";
          goto LAB_0012fbef;
        }
        goto switchD_0012fa85_caseD_3;
      }
      util::variant::GetString_abi_cxx11_(&local_90,(variant *)(this + 8));
      std::operator+(&local_70,"symbol \'",&local_90);
      std::operator+(__return_storage_ptr__,&local_70,"\'");
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = &local_90;
LAB_0012fe5e:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

static std::string token_got_string(Token t)
	{
		switch (t.type)
		{
			case Token::Invalid:    return "invalid token";
			case Token::Identifier: return "identifier '" + std::string(t.data) + "'";
			case Token::String:     return "string '" + cut_string(t.data) + "'";
			case Token::Integer:    return "integer '" + std::string(t.data) + "'";
			case Token::Float:      return "float '" + std::string(t.data) + "'";
			case Token::Boolean:    return "boolean '" + std::string(bool(t.data) ? "true" : "false") + "'";
			case Token::Operator:   return "operator '" + op_to_string(int(t.data)) + "'";
			case Token::Symbol:     return "symbol '" + std::string(t.data) + "'";
			case Token::NewLine:    return "new-line";
			case Token::EndOfFile:  return "end of file";
		}

		return "unknown token";
	}